

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall SolverTest_GetIntOption_Test::TestBody(SolverTest_GetIntOption_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  char *expected_expression;
  OptionError *anon_var_0_2;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  OptionError *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  OptionError *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Solver *s;
  TestSolverWithOptions test_solver;
  char *in_stack_fffffffffffffb48;
  undefined2 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb52;
  undefined1 in_stack_fffffffffffffb53;
  undefined1 in_stack_fffffffffffffb54;
  undefined1 in_stack_fffffffffffffb55;
  undefined1 in_stack_fffffffffffffb56;
  undefined1 in_stack_fffffffffffffb57;
  SolverOptionManager *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  char *in_stack_fffffffffffffb68;
  int iVar6;
  char *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb7c;
  Type type;
  AssertHelper *this_00;
  ConstCharPtr local_450 [3];
  Message *in_stack_fffffffffffffbc8;
  AssertHelper *in_stack_fffffffffffffbd0;
  ConstCharPtr local_408 [4];
  byte local_3e1;
  ConstCharPtr local_3e0 [3];
  char *local_3c8;
  undefined4 local_3bc;
  AssertionResult local_3b8 [3];
  LongLong local_388;
  undefined4 local_37c;
  AssertionResult local_378;
  AssertHelper *local_368;
  AssertHelper in_stack_fffffffffffffca0;
  
  this_00 = (AssertHelper *)&stack0xfffffffffffffca0;
  TestSolverWithOptions::TestSolverWithOptions
            ((TestSolverWithOptions *)in_stack_fffffffffffffca0.data_);
  local_37c = 0;
  local_368 = this_00;
  local_388 = mp::SolverOptionManager::GetIntOption
                        ((SolverOptionManager *)
                         CONCAT17(in_stack_fffffffffffffb57,
                                  CONCAT16(in_stack_fffffffffffffb56,
                                           CONCAT15(in_stack_fffffffffffffb55,
                                                    CONCAT14(in_stack_fffffffffffffb54,
                                                             CONCAT13(in_stack_fffffffffffffb53,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffb52,
                                                  in_stack_fffffffffffffb50)))))),
                         in_stack_fffffffffffffb48);
  testing::internal::EqHelper<true>::Compare<int,long_long>
            (in_stack_fffffffffffffb68,
             (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
             (int *)in_stack_fffffffffffffb58,
             (longlong *)
             CONCAT17(in_stack_fffffffffffffb57,
                      CONCAT16(in_stack_fffffffffffffb56,
                               CONCAT15(in_stack_fffffffffffffb55,
                                        CONCAT14(in_stack_fffffffffffffb54,
                                                 CONCAT13(in_stack_fffffffffffffb53,
                                                          CONCAT12(in_stack_fffffffffffffb52,
                                                                   in_stack_fffffffffffffb50)))))),
             in_stack_fffffffffffffb48);
  iVar6 = (int)((ulong)in_stack_fffffffffffffb68 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_378);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb7c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffb70 =
         testing::AssertionResult::failure_message((AssertionResult *)0x144d97);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,in_stack_fffffffffffffb70,iVar6,
               (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffb57,
                        CONCAT16(in_stack_fffffffffffffb56,
                                 CONCAT15(in_stack_fffffffffffffb55,
                                          CONCAT14(in_stack_fffffffffffffb54,
                                                   CONCAT13(in_stack_fffffffffffffb53,
                                                            CONCAT12(in_stack_fffffffffffffb52,
                                                                     in_stack_fffffffffffffb50))))))
              );
    testing::Message::~Message((Message *)0x144df4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x144e4c);
  local_3bc = 0x2a;
  expected_expression =
       (char *)mp::SolverOptionManager::GetIntOption
                         ((SolverOptionManager *)
                          CONCAT17(in_stack_fffffffffffffb57,
                                   CONCAT16(in_stack_fffffffffffffb56,
                                            CONCAT15(in_stack_fffffffffffffb55,
                                                     CONCAT14(in_stack_fffffffffffffb54,
                                                              CONCAT13(in_stack_fffffffffffffb53,
                                                                       CONCAT12(
                                                  in_stack_fffffffffffffb52,
                                                  in_stack_fffffffffffffb50)))))),
                          in_stack_fffffffffffffb48);
  local_3c8 = expected_expression;
  testing::internal::EqHelper<false>::Compare<int,long_long>
            (expected_expression,
             (char *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
             (int *)in_stack_fffffffffffffb58,
             (longlong *)
             CONCAT17(in_stack_fffffffffffffb57,
                      CONCAT16(in_stack_fffffffffffffb56,
                               CONCAT15(in_stack_fffffffffffffb55,
                                        CONCAT14(in_stack_fffffffffffffb54,
                                                 CONCAT13(in_stack_fffffffffffffb53,
                                                          CONCAT12(in_stack_fffffffffffffb52,
                                                                   in_stack_fffffffffffffb50)))))));
  iVar6 = (int)((ulong)expected_expression >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_3b8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffb58 =
         (SolverOptionManager *)
         testing::AssertionResult::failure_message((AssertionResult *)0x144f24);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,in_stack_fffffffffffffb70,iVar6,
               (char *)CONCAT17(uVar2,in_stack_fffffffffffffb60));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               CONCAT17(in_stack_fffffffffffffb57,
                        CONCAT16(in_stack_fffffffffffffb56,
                                 CONCAT15(in_stack_fffffffffffffb55,
                                          CONCAT14(in_stack_fffffffffffffb54,
                                                   CONCAT13(in_stack_fffffffffffffb53,
                                                            CONCAT12(in_stack_fffffffffffffb52,
                                                                     in_stack_fffffffffffffb50))))))
              );
    testing::Message::~Message((Message *)0x144f81);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x144fd9);
  testing::internal::ConstCharPtr::ConstCharPtr(local_3e0,"");
  uVar3 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_3e0);
  if ((bool)uVar3) {
    local_3e1 = 0;
    in_stack_fffffffffffffb56 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffb56) {
      mp::SolverOptionManager::GetDblOption
                ((SolverOptionManager *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb56,
                                         CONCAT15(in_stack_fffffffffffffb55,
                                                  CONCAT14(in_stack_fffffffffffffb54,
                                                           CONCAT13(in_stack_fffffffffffffb53,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffb52,
                                                  in_stack_fffffffffffffb50)))))),
                 in_stack_fffffffffffffb48);
    }
    if ((local_3e1 & 1) != 0) goto LAB_001451b1;
    local_3e0[0].value =
         "Expected: s.GetDblOption(\"intopt1\") throws an exception of type OptionError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)this_00);
  testing::internal::AssertHelper::AssertHelper
            (this_00,type,in_stack_fffffffffffffb70,iVar6,
             (char *)CONCAT17(uVar2,in_stack_fffffffffffffb60));
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb56,
                                     CONCAT15(in_stack_fffffffffffffb55,
                                              CONCAT14(in_stack_fffffffffffffb54,
                                                       CONCAT13(in_stack_fffffffffffffb53,
                                                                CONCAT12(in_stack_fffffffffffffb52,
                                                                         in_stack_fffffffffffffb50))
                                                      )))));
  testing::Message::~Message((Message *)0x145166);
LAB_001451b1:
  testing::internal::ConstCharPtr::ConstCharPtr(local_408,"");
  uVar4 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_408);
  if ((bool)uVar4) {
    in_stack_fffffffffffffb54 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffb54) {
      mp::SolverOptionManager::GetStrOption_abi_cxx11_
                (in_stack_fffffffffffffb58,
                 (char *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb56,
                                                 CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffb54,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffb53,
                                                  CONCAT12(in_stack_fffffffffffffb52,
                                                           in_stack_fffffffffffffb50)))))));
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd0);
    }
    local_408[0].value =
         "Expected: s.GetStrOption(\"intopt1\") throws an exception of type OptionError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)this_00);
  testing::internal::AssertHelper::AssertHelper
            (this_00,type,in_stack_fffffffffffffb70,iVar6,
             (char *)CONCAT17(uVar2,in_stack_fffffffffffffb60));
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb56,
                                     CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffb54,
                                                             CONCAT13(in_stack_fffffffffffffb53,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffb52,
                                                  in_stack_fffffffffffffb50)))))));
  testing::Message::~Message((Message *)0x14532f);
  testing::internal::ConstCharPtr::ConstCharPtr(local_450,"");
  uVar5 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_450);
  if ((bool)uVar5) {
    in_stack_fffffffffffffb52 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffffb52) {
      mp::SolverOptionManager::GetIntOption
                ((SolverOptionManager *)
                 CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb56,
                                         CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffb54,
                                                                 CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffb52,
                                                  in_stack_fffffffffffffb50)))))),
                 in_stack_fffffffffffffb48);
    }
    local_450[0].value =
         "Expected: s.GetIntOption(\"badopt\") throws an exception of type OptionError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)this_00);
  testing::internal::AssertHelper::AssertHelper
            (this_00,type,in_stack_fffffffffffffb70,iVar6,
             (char *)CONCAT17(uVar2,in_stack_fffffffffffffb60));
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)
             CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb56,
                                     CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffb54,
                                                             CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffb52,
                                                  in_stack_fffffffffffffb50)))))));
  testing::Message::~Message((Message *)0x1454c2);
  TestSolverWithOptions::~TestSolverWithOptions
            ((TestSolverWithOptions *)
             CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffb56,
                                     CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffffb54,
                                                             CONCAT13(uVar5,CONCAT12(
                                                  in_stack_fffffffffffffb52,
                                                  in_stack_fffffffffffffb50)))))));
  return;
}

Assistant:

TEST(SolverTest, GetIntOption) {
  TestSolverWithOptions test_solver;
  Solver &s = test_solver;
  EXPECT_EQ(0, s.GetIntOption("intopt1"));
  test_solver.intopt1 = 42;
  EXPECT_EQ(42, s.GetIntOption("intopt1"));
  EXPECT_THROW(s.GetDblOption("intopt1"), OptionError);
  EXPECT_THROW(s.GetStrOption("intopt1"), OptionError);
  EXPECT_THROW(s.GetIntOption("badopt"), OptionError);
}